

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O2

int __thiscall ON_Mesh::SolidOrientation(ON_Mesh *this)

{
  int iVar1;
  char cVar2;
  
  cVar2 = this->m_mesh_is_solid;
  if ((byte)(cVar2 - 4U) < 0xfd) {
    IsSolid(this);
    cVar2 = this->m_mesh_is_solid;
  }
  iVar1 = 0;
  if ((byte)(cVar2 - 1U) < 3) {
    iVar1 = (&DAT_006a04f0)[(byte)(cVar2 - 1U)];
  }
  return iVar1;
}

Assistant:

int ON_Mesh::SolidOrientation() const
{

  if ( m_mesh_is_solid <= 0 || m_mesh_is_solid > 3 )
  {
    // NOTE: calling IsClosed() will set m_mesh_is_solid
    //       to 3 if mes is non-manifold
    if ( IsSolid() )
    {
    }
  }

  switch(m_mesh_is_solid)
  {
  case 1:
    return 1;
    break;

  case 2:
    return -1;
    break;

  case 3:
    return 0;
    break;
  }

  return 0; // answer "no" if we don't know.
}